

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

ClippedEdge * __thiscall MutableS2ShapeIndex::EdgeAllocator::NewClippedEdge(EdgeAllocator *this)

{
  pointer *ppuVar1;
  iterator __position;
  pointer puVar2;
  size_t sVar3;
  _Head_base<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_false> local_28;
  
  sVar3 = this->size_;
  puVar2 = (this->clipped_edges_).
           super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->clipped_edges_).
       super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (sVar3 == (long)__position._M_current - (long)puVar2 >> 3) {
    local_28._M_head_impl = (ClippedEdge *)operator_new(0x28);
    ((local_28._M_head_impl)->bound).bounds_[0].bounds_.c_[0] = 0x3ff0000000000000;
    *(VType *)((long)((local_28._M_head_impl)->bound).bounds_ + 8) = 0.0;
    (((R1Interval *)((long)((local_28._M_head_impl)->bound).bounds_ + 0x10))->bounds_).c_[0] = 1.0;
    *(VType *)((long)((local_28._M_head_impl)->bound).bounds_ + 0x18) = 0.0;
    if (__position._M_current ==
        (this->clipped_edges_).
        super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
      ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge*>
                ((vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
                  *)&this->clipped_edges_,__position,&local_28._M_head_impl);
      sVar3 = this->size_;
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
      ._M_t.
      super__Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
      .super__Head_base<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_false>._M_head_impl =
           local_28._M_head_impl;
      ppuVar1 = &(this->clipped_edges_).
                 super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    puVar2 = (this->clipped_edges_).
             super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->size_ = sVar3 + 1;
  return (ClippedEdge *)
         ((_Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
           )puVar2[sVar3]._M_t.
            super___uniq_ptr_impl<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
            ._M_t).
         super__Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
  ;
}

Assistant:

ClippedEdge* NewClippedEdge() {
    if (size_ == clipped_edges_.size()) {
      clipped_edges_.emplace_back(new ClippedEdge);
    }
    return clipped_edges_[size_++].get();
  }